

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O3

void __thiscall
ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
          (ObserverManager *this,offset_in_FooBarProtocol_to_subr method,char *args)

{
  iterator iVar1;
  iterator iVar2;
  __node_base _Var3;
  long *plVar4;
  pair<FooBarProtocol_*,_unsigned_long> *ppVar5;
  ObserverManager *pOVar6;
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  observers;
  allocator local_79;
  pair<FooBarProtocol_*,_unsigned_long> *local_78;
  iterator iStack_70;
  pair<FooBarProtocol_*,_unsigned_long> *local_68;
  pair<FooBarProtocol_*,_unsigned_long> local_60;
  FooBarProtocol local_50;
  offset_in_FooBarProtocol_to_subr local_40;
  char *local_38;
  
  local_78 = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  iStack_70._M_current = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  local_68 = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  if (ObserverContainer<FooBarProtocol>::observers._M_h._M_before_begin._M_nxt !=
      (_Hash_node_base *)0x0) {
    _Var3._M_nxt = ObserverContainer<FooBarProtocol>::observers._M_h._M_before_begin._M_nxt;
    local_40 = method;
    local_38 = args;
    do {
      local_60.first = (FooBarProtocol *)_Var3._M_nxt[1]._M_nxt;
      local_60.second = ((local_60.first)->super_BaseObserverProtocol).observerId;
      if (iStack_70._M_current == local_68) {
        std::
        vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
        ::_M_realloc_insert<std::pair<FooBarProtocol*,unsigned_long>>
                  ((vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
                    *)&local_78,iStack_70,&local_60);
      }
      else {
        (iStack_70._M_current)->first = local_60.first;
        (iStack_70._M_current)->second = local_60.second;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      iVar1._M_current = iStack_70._M_current;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
    if (local_78 != iStack_70._M_current) {
      ppVar5 = local_78;
      do {
        iVar2 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&unsubscribeMap._M_h,&ppVar5->second);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
            ._M_cur != (__node_type *)0x0) {
          plVar4 = (long *)((long)&(ppVar5->first->super_BaseObserverProtocol).
                                   _vptr_BaseObserverProtocol + local_40);
          pOVar6 = this;
          if (((ulong)this & 1) != 0) {
            pOVar6 = *(ObserverManager **)(this + *plVar4 + -1);
          }
          std::__cxx11::string::string((string *)&local_60,local_38,&local_79);
          (*(code *)pOVar6)(plVar4,&local_60);
          if (local_60.first != &local_50) {
            operator_delete(local_60.first);
          }
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != iVar1._M_current);
    }
    if (local_78 != (pair<FooBarProtocol_*,_unsigned_long> *)0x0) {
      operator_delete(local_78);
    }
  }
  return;
}

Assistant:

static void notify(void (P::*method)(MethodArgumentTypes...), ActualArgumentTypes... args) {
        std::vector<std::pair<P*, BaseObserverProtocol::id_t>> observers;
        for (const auto& o : ObserverContainer<P>::observers) {
            observers.push_back(std::make_pair(o, o->observerId));
        }

        for (const auto& p : observers) {
            if (unsubscribeMap.find(p.second) == std::end(unsubscribeMap)) {
                continue;
            }
            (p.first->*method)(args...);
        }
    }